

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OctreeTracer.cpp
# Opt level: O0

void __thiscall
OctreeTracer::create_beam_render_pass(OctreeTracer *this,shared_ptr<myvk::Device> *device)

{
  shared_ptr<myvk::RenderPass> *in_RDI;
  VkRenderPassCreateInfo render_pass_info;
  VkSubpassDependency subpass_dependency;
  VkSubpassDescription subpass;
  VkAttachmentReference color_attachment_ref;
  VkAttachmentDescription color_attachment;
  shared_ptr<myvk::RenderPass> *in_stack_fffffffffffffef8;
  undefined4 local_e8 [5];
  undefined4 local_d4;
  undefined1 *local_d0;
  undefined4 local_c8;
  undefined1 *local_c0;
  undefined4 local_b8;
  undefined4 in_stack_ffffffffffffff58;
  VkStructureType VVar1;
  undefined1 local_88 [4];
  uint32_t local_84;
  undefined4 local_70;
  undefined4 *local_68;
  undefined8 local_58;
  undefined4 local_3c;
  undefined4 local_38;
  undefined1 local_34 [4];
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  
  memset(local_34,0,0x24);
  local_30 = 100;
  local_2c = 1;
  local_28 = 1;
  local_24 = 0;
  local_20 = 2;
  local_1c = 1;
  local_18 = 0;
  local_14 = 5;
  memset(&local_3c,0,8);
  local_3c = 0;
  local_38 = 2;
  memset(local_88,0,0x48);
  local_84 = 0;
  local_70 = 1;
  local_68 = &local_3c;
  local_58 = 0;
  memset(&stack0xffffffffffffff5c,0,0x1c);
  VVar1 = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  memset(local_e8,0,0x40);
  local_e8[0] = 0x26;
  local_d4 = 1;
  local_d0 = local_34;
  local_c8 = 1;
  local_c0 = local_88;
  local_b8 = 1;
  myvk::RenderPass::Create
            ((Ptr<Device> *)CONCAT44(VVar1,in_stack_ffffffffffffff58),
             (VkRenderPassCreateInfo *)&stack0xffffffffffffff5c);
  std::shared_ptr<myvk::RenderPass>::operator=(in_RDI,in_stack_fffffffffffffef8);
  std::shared_ptr<myvk::RenderPass>::~shared_ptr((shared_ptr<myvk::RenderPass> *)0x162e5d);
  return;
}

Assistant:

void OctreeTracer::create_beam_render_pass(const std::shared_ptr<myvk::Device> &device) {
	VkAttachmentDescription color_attachment = {};
	color_attachment.format = VK_FORMAT_R32_SFLOAT;
	color_attachment.samples = VK_SAMPLE_COUNT_1_BIT;
	color_attachment.loadOp = VK_ATTACHMENT_LOAD_OP_CLEAR;
	color_attachment.storeOp = VK_ATTACHMENT_STORE_OP_STORE;
	color_attachment.stencilLoadOp = VK_ATTACHMENT_LOAD_OP_DONT_CARE;
	color_attachment.stencilStoreOp = VK_ATTACHMENT_STORE_OP_DONT_CARE;
	color_attachment.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
	color_attachment.finalLayout = VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL;

	VkAttachmentReference color_attachment_ref = {};
	color_attachment_ref.attachment = 0;
	color_attachment_ref.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;

	VkSubpassDescription subpass = {};
	subpass.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
	subpass.colorAttachmentCount = 1;
	subpass.pColorAttachments = &color_attachment_ref;
	subpass.pDepthStencilAttachment = nullptr;

	VkSubpassDependency subpass_dependency = {};
	subpass_dependency.srcSubpass = 0;
	subpass_dependency.dstSubpass = VK_SUBPASS_EXTERNAL;
	subpass_dependency.srcStageMask = VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT;
	subpass_dependency.dstStageMask = VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT;
	subpass_dependency.srcAccessMask = VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT;
	subpass_dependency.dstAccessMask = VK_ACCESS_SHADER_READ_BIT;

	VkRenderPassCreateInfo render_pass_info = {};
	render_pass_info.sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
	render_pass_info.attachmentCount = 1;
	render_pass_info.pAttachments = &color_attachment;
	render_pass_info.subpassCount = 1;
	render_pass_info.pSubpasses = &subpass;
	render_pass_info.dependencyCount = 1;
	render_pass_info.pDependencies = &subpass_dependency;

	m_beam_render_pass = myvk::RenderPass::Create(device, render_pass_info);
}